

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini_miner.cpp
# Opt level: O2

map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_> *
__thiscall
node::MiniMiner::CalculateBumpFees
          (map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
           *__return_storage_ptr__,MiniMiner *this,CFeeRate *target_feerate)

{
  _Rb_tree_header *p_Var1;
  map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
  *this_00;
  COutPoint *pCVar2;
  iterator __position;
  _Base_ptr p_Var3;
  iterator iVar4;
  CAmount CVar5;
  COutPoint *outpoint;
  long lVar6;
  COutPoint *pCVar7;
  long in_FS_OFFSET;
  optional<CFeeRate> target_feerate_00;
  CAmount bump_fee;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_ready_to_calculate == false) {
    p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
    *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl = 0;
    *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  }
  else {
    target_feerate_00.super__Optional_base<CFeeRate,_true,_true>._M_payload.
    super__Optional_payload_base<CFeeRate>._8_8_ = 1;
    target_feerate_00.super__Optional_base<CFeeRate,_true,_true>._M_payload.
    super__Optional_payload_base<CFeeRate>._M_payload =
         (_Storage<CFeeRate,_true>)target_feerate->nSatoshisPerK;
    BuildMockTemplate(this,target_feerate_00);
    p_Var1 = &(this->m_requested_outpoints_by_txid)._M_t._M_impl.super__Rb_tree_header;
    this_00 = &this->m_bump_fees;
    for (p_Var3 = (this->m_in_block)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(this->m_in_block)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var3)) {
      __position = std::
                   _Rb_tree<uint256,_std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>,_std::_Select1st<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>_>_>
                   ::find(&(this->m_requested_outpoints_by_txid)._M_t,(key_type *)(p_Var3 + 1));
      if ((_Rb_tree_header *)__position._M_node != p_Var1) {
        pCVar2 = (COutPoint *)__position._M_node[2]._M_parent;
        for (pCVar7 = *(COutPoint **)(__position._M_node + 2); pCVar7 != pCVar2; pCVar7 = pCVar7 + 1
            ) {
          bump_fee = bump_fee & 0xffffffff00000000;
          std::
          _Rb_tree<COutPoint,std::pair<COutPoint_const,long>,std::_Select1st<std::pair<COutPoint_const,long>>,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,long>>>
          ::_M_emplace_unique<COutPoint_const&,int>
                    ((_Rb_tree<COutPoint,std::pair<COutPoint_const,long>,std::_Select1st<std::pair<COutPoint_const,long>>,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,long>>>
                      *)this_00,pCVar7,(int *)&bump_fee);
        }
        std::
        _Rb_tree<uint256,std::pair<uint256_const,std::vector<COutPoint,std::allocator<COutPoint>>>,std::_Select1st<std::pair<uint256_const,std::vector<COutPoint,std::allocator<COutPoint>>>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::vector<COutPoint,std::allocator<COutPoint>>>>>
        ::erase_abi_cxx11_((_Rb_tree<uint256,std::pair<uint256_const,std::vector<COutPoint,std::allocator<COutPoint>>>,std::_Select1st<std::pair<uint256_const,std::vector<COutPoint,std::allocator<COutPoint>>>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::vector<COutPoint,std::allocator<COutPoint>>>>>
                            *)&this->m_requested_outpoints_by_txid,__position);
      }
    }
    for (p_Var3 = (this->m_requested_outpoints_by_txid)._M_t._M_impl.super__Rb_tree_header._M_header
                  ._M_left; (_Rb_tree_header *)p_Var3 != p_Var1;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var3)) {
      iVar4 = std::
              _Rb_tree<uint256,_std::pair<const_uint256,_node::MiniMinerMempoolEntry>,_std::_Select1st<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>
              ::find(&(this->m_entries_by_txid)._M_t,(key_type *)(p_Var3 + 1));
      if ((_Rb_tree_header *)iVar4._M_node !=
          &(this->m_entries_by_txid)._M_t._M_impl.super__Rb_tree_header) {
        CFeeRate::GetFee(target_feerate,*(uint32_t *)&iVar4._M_node[2]._M_right);
        CVar5 = CFeeRate::GetFee(target_feerate,*(uint32_t *)&iVar4._M_node[2]._M_right);
        lVar6 = CVar5 - (long)iVar4._M_node[3]._M_parent;
        CVar5 = CFeeRate::GetFee(target_feerate,*(uint32_t *)&iVar4._M_node[2]._M_left);
        bump_fee = CVar5 - *(long *)(iVar4._M_node + 3);
        if (CVar5 - *(long *)(iVar4._M_node + 3) < lVar6) {
          bump_fee = lVar6;
        }
        pCVar2 = (COutPoint *)p_Var3[2]._M_parent;
        for (pCVar7 = *(COutPoint **)(p_Var3 + 2); pCVar7 != pCVar2; pCVar7 = pCVar7 + 1) {
          std::
          _Rb_tree<COutPoint,std::pair<COutPoint_const,long>,std::_Select1st<std::pair<COutPoint_const,long>>,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,long>>>
          ::_M_emplace_unique<COutPoint_const&,long_const&>
                    ((_Rb_tree<COutPoint,std::pair<COutPoint_const,long>,std::_Select1st<std::pair<COutPoint_const,long>>,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,long>>>
                      *)this_00,pCVar7,&bump_fee);
        }
      }
    }
    std::
    _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
    ::_Rb_tree(&__return_storage_ptr__->_M_t,&this_00->_M_t);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<COutPoint, CAmount> MiniMiner::CalculateBumpFees(const CFeeRate& target_feerate)
{
    if (!m_ready_to_calculate) return {};
    // Build a block template until the target feerate is hit.
    BuildMockTemplate(target_feerate);

    // Each transaction that "made it into the block" has a bumpfee of 0, i.e. they are part of an
    // ancestor package with at least the target feerate and don't need to be bumped.
    for (const auto& txid : m_in_block) {
        // Not all of the block transactions were necessarily requested.
        auto it = m_requested_outpoints_by_txid.find(txid);
        if (it != m_requested_outpoints_by_txid.end()) {
            for (const auto& outpoint : it->second) {
                m_bump_fees.emplace(outpoint, 0);
            }
            m_requested_outpoints_by_txid.erase(it);
        }
    }

    // A transactions and its ancestors will only be picked into a block when
    // both the ancestor set feerate and the individual feerate meet the target
    // feerate.
    //
    // We had to convince ourselves that after running the mini miner and
    // picking all eligible transactions into our MockBlockTemplate, there
    // could still be transactions remaining that have a lower individual
    // feerate than their ancestor feerate. So here is an example:
    //
    //               ┌─────────────────┐
    //               │                 │
    //               │   Grandparent   │
    //               │    1700 vB      │
    //               │    1700 sats    │                    Target feerate: 10    s/vB
    //               │       1 s/vB    │    GP Ancestor Set Feerate (ASFR):  1    s/vB
    //               │                 │                           P1_ASFR:  9.84 s/vB
    //               └──────▲───▲──────┘                           P2_ASFR:  2.47 s/vB
    //                      │   │                                   C_ASFR: 10.27 s/vB
    // ┌───────────────┐    │   │    ┌──────────────┐
    // │               ├────┘   └────┤              │             ⇒ C_FR < TFR < C_ASFR
    // │   Parent 1    │             │   Parent 2   │
    // │    200 vB     │             │    200 vB    │
    // │  17000 sats   │             │   3000 sats  │
    // │     85 s/vB   │             │     15 s/vB  │
    // │               │             │              │
    // └───────────▲───┘             └───▲──────────┘
    //             │                     │
    //             │    ┌───────────┐    │
    //             └────┤           ├────┘
    //                  │   Child   │
    //                  │  100 vB   │
    //                  │  900 sats │
    //                  │    9 s/vB │
    //                  │           │
    //                  └───────────┘
    //
    // We therefore calculate both the bump fee that is necessary to elevate
    // the individual transaction to the target feerate:
    //         target_feerate × tx_size - tx_fees
    // and the bump fee that is necessary to bump the entire ancestor set to
    // the target feerate:
    //         target_feerate × ancestor_set_size - ancestor_set_fees
    // By picking the maximum from the two, we ensure that a transaction meets
    // both criteria.
    for (const auto& [txid, outpoints] : m_requested_outpoints_by_txid) {
        auto it = m_entries_by_txid.find(txid);
        Assume(it != m_entries_by_txid.end());
        if (it != m_entries_by_txid.end()) {
            Assume(target_feerate.GetFee(it->second.GetSizeWithAncestors()) > std::min(it->second.GetModifiedFee(), it->second.GetModFeesWithAncestors()));
            CAmount bump_fee_with_ancestors = target_feerate.GetFee(it->second.GetSizeWithAncestors()) - it->second.GetModFeesWithAncestors();
            CAmount bump_fee_individual = target_feerate.GetFee(it->second.GetTxSize()) - it->second.GetModifiedFee();
            const CAmount bump_fee{std::max(bump_fee_with_ancestors, bump_fee_individual)};
            Assume(bump_fee >= 0);
            for (const auto& outpoint : outpoints) {
                m_bump_fees.emplace(outpoint, bump_fee);
            }
        }
    }
    return m_bump_fees;
}